

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O1

void __thiscall
CTestResource_Test2DLinearResource_Test::TestBody(CTestResource_Test2DLinearResource_Test *this)

{
  CTestResource_Test2DLinearResource_Test *pCVar1;
  undefined4 uVar2;
  int iVar3;
  GMM_RESOURCE_INFO *pGVar4;
  uint32_t i;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  CTestResource_Test2DLinearResource_Test *local_40;
  long local_38;
  
  local_68 = 0;
  uStack_b0 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_c8 = 2;
  uStack_60 = 0x100000000;
  uStack_c0 = 0x400000000;
  local_b8 = 0x80000;
  lVar7 = 0;
  uVar5 = 0;
  local_40 = this;
  do {
    uVar2 = 0;
    if (uVar5 < 5) {
      uVar2 = *(undefined4 *)((long)&DAT_001ad6d0 + lVar7);
    }
    local_c8 = CONCAT44(uVar2,(undefined4)local_c8);
    local_98 = 1;
    uStack_90 = CONCAT44(uStack_90._4_4_,1);
    pGVar4 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_c8);
    pCVar1 = local_40;
    iVar3 = 0;
    if (uVar5 < 5) {
      iVar3 = *(int *)((long)&DAT_001ad674 + lVar7);
    }
    uVar8 = ((int)local_98 + 0xfU & 0xfffffff0) * iVar3;
    uVar6 = (int)uStack_90 + 3;
    if (uVar8 < 0x21) {
      uVar8 = 0x20;
    }
    uVar8 = uVar8 + 0x3f & 0xffffffc0;
    local_38 = lVar7;
    CTestResource::VerifyResourceHAlign<true>(&local_40->super_CTestResource,pGVar4,0x10);
    CTestResource::VerifyResourceVAlign<true>(&pCVar1->super_CTestResource,pGVar4,4);
    CTestResource::VerifyResourcePitch<true>(&pCVar1->super_CTestResource,pGVar4,uVar8);
    lVar7 = local_38;
    CTestResource::VerifyResourceSize<true>
              (&pCVar1->super_CTestResource,pGVar4,
               (ulong)((uVar6 & 0xfffffffc) * uVar8 + 0xfff & 0xfffff000));
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar4);
    uVar5 = uVar5 + 1;
    lVar7 = lVar7 + 4;
  } while (uVar5 != 5);
  lVar7 = 0;
  uVar5 = 0;
  do {
    uVar2 = 0;
    if (uVar5 < 5) {
      uVar2 = *(undefined4 *)((long)&DAT_001ad6d0 + lVar7);
    }
    local_c8 = CONCAT44(uVar2,(undefined4)local_c8);
    local_98 = 0x100;
    uStack_90 = CONCAT44(uStack_90._4_4_,0x100);
    pGVar4 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_c8);
    pCVar1 = local_40;
    iVar3 = 0;
    if (uVar5 < 5) {
      iVar3 = *(int *)((long)&DAT_001ad674 + lVar7);
    }
    uVar8 = ((int)local_98 + 0xfU & 0xfffffff0) * iVar3;
    uVar6 = (int)uStack_90 + 3;
    if (uVar8 < 0x21) {
      uVar8 = 0x20;
    }
    uVar8 = uVar8 + 0x3f & 0xffffffc0;
    local_38 = lVar7;
    CTestResource::VerifyResourceHAlign<true>(&local_40->super_CTestResource,pGVar4,0x10);
    CTestResource::VerifyResourceVAlign<true>(&pCVar1->super_CTestResource,pGVar4,4);
    CTestResource::VerifyResourcePitch<true>(&pCVar1->super_CTestResource,pGVar4,uVar8);
    lVar7 = local_38;
    CTestResource::VerifyResourceSize<true>
              (&pCVar1->super_CTestResource,pGVar4,
               (ulong)((uVar6 & 0xfffffffc) * uVar8 + 0xfff & 0xfffff000));
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar4);
    uVar5 = uVar5 + 1;
    lVar7 = lVar7 + 4;
  } while (uVar5 != 5);
  return;
}

Assistant:

TEST_F(CTestResource, Test2DLinearResource)
{
    const uint32_t HAlign = 16;
    const uint32_t VAlign = 4;

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_2D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.Linear    = 1;
    gmmParams.Flags.Gpu.Texture    = 1;

    //Allocate 1x1 surface
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1;
        gmmParams.BaseHeight  = 0x1;

        const uint32_t MinPitch       = 32;
        const uint32_t PitchAlignment = 64;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        const uint32_t AlignedWidth  = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        const uint32_t AlignedHeight = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);
        uint32_t       PitchInBytes  = AlignedWidth * GetBppValue(bpp);
        PitchInBytes                 = GMM_ULT_MAX(PitchInBytes, MinPitch);
        PitchInBytes                 = GMM_ULT_ALIGN(PitchInBytes, PitchAlignment);
        const uint32_t AlignedSize   = GMM_ULT_ALIGN(PitchInBytes * AlignedHeight, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, PitchInBytes);
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 256 x 256
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 256;
        gmmParams.BaseHeight  = 256;

        const uint32_t MinPitch       = 32;
        const uint32_t PitchAlignment = 64;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        const uint32_t AlignedWidth  = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        const uint32_t AlignedHeight = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);
        uint32_t       PitchInBytes  = AlignedWidth * GetBppValue(bpp);
        PitchInBytes                 = GMM_ULT_MAX(PitchInBytes, MinPitch);
        PitchInBytes                 = GMM_ULT_ALIGN(PitchInBytes, PitchAlignment);
        const uint32_t AlignedSize   = GMM_ULT_ALIGN(PitchInBytes * AlignedHeight, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, PitchInBytes);
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}